

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void SetTextureNoErr(side_t *side,int position,DWORD *color,char *name,bool *validcolor,bool isFog)

{
  byte bVar1;
  bool bVar2;
  FTextureID FVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  char name2 [9];
  uint local_40;
  char *local_38;
  
  *validcolor = false;
  FVar3 = FTextureManager::CheckForTexture(&TexMan,name,1,3);
  if (FVar3.texnum < 0) {
    strncpy(name2,name + 1,7);
    name2[7] = '\0';
    if (*name == '#') {
      sVar5 = strlen(name);
      *validcolor = false;
      if ((int)sVar5 < 7) {
        FVar3.texnum = 0;
        goto LAB_00448062;
      }
      for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
        iVar4 = isxdigit((int)name2[lVar11]);
        if (iVar4 == 0) {
          name2[lVar11] = '0';
        }
      }
      uVar10 = 0;
      iVar4 = 0;
      if ((int)sVar5 != 7) {
        bVar9 = 0x5a;
        if ((name2[6] & 0xdfU) < 0x5a) {
          bVar9 = name2[6] & 0xdfU;
        }
        bVar1 = 0x41;
        if (0x41 < bVar9) {
          bVar1 = bVar9;
        }
        iVar4 = bVar1 - 0x41;
      }
      name2[6] = '\0';
      lVar11 = strtol(name2 + 4,(char **)0x0,0x10);
      name2[4] = '\0';
      lVar7 = strtol(name2 + 2,(char **)0x0,0x10);
      name2[2] = '\0';
      lVar8 = strtol(name2,(char **)0x0,0x10);
      if (!isFog) {
        if (iVar4 == 0) {
          bVar2 = false;
          goto LAB_004481cf;
        }
        uVar10 = (iVar4 * 0xff & 0xffffU) / 0x19 << 0x18;
      }
      local_40 = (uint)lVar11;
      *color = (int)lVar7 << 8 | local_40 | (int)lVar8 << 0x10 | uVar10;
      bVar2 = true;
    }
    else {
      uVar6 = strtoul(name,&local_38,0x10);
      *color = (DWORD)uVar6;
      bVar2 = (local_38 <= name + 6 && name + 2 <= local_38) && *local_38 == '\0';
    }
LAB_004481cf:
    *validcolor = bVar2;
  }
  else {
LAB_00448062:
    side->textures[position].texture.texnum = FVar3.texnum;
  }
  return;
}

Assistant:

static void SetTextureNoErr (side_t *side, int position, DWORD *color, const char *name, bool *validcolor, bool isFog)
{
	FTextureID texture;
	*validcolor = false;
	texture = TexMan.CheckForTexture (name, FTexture::TEX_Wall,	
		FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);
	if (!texture.Exists())
	{
		char name2[9];
		char *stop;
		strncpy (name2, name+1, 7);
		name2[7] = 0;
		if (*name != '#')
		{
			*color = strtoul (name, &stop, 16);
			texture = FNullTextureID();
			*validcolor = (*stop == 0) && (stop >= name + 2) && (stop <= name + 6);
			return;
		}
		else	// Support for Legacy's color format!
		{
			int l=(int)strlen(name);
			texture = FNullTextureID();
			*validcolor = false;
			if (l>=7) 
			{
				for(stop=name2;stop<name2+6;stop++) if (!isxdigit(*stop)) *stop='0';

				int factor = l==7? 0 : clamp<int> ((name2[6]&223)-'A', 0, 25);

				name2[6]=0; int blue=strtol(name2+4,NULL,16);
				name2[4]=0; int green=strtol(name2+2,NULL,16);
				name2[2]=0; int red=strtol(name2,NULL,16);

				if (!isFog) 
				{
					if (factor==0) 
					{
						*validcolor=false;
						return;
					}
					factor = factor * 255 / 25;
				}
				else
				{
					factor=0;
				}

				*color=MAKEARGB(factor, red, green, blue);
				texture = FNullTextureID();
				*validcolor = true;
				return;
			}
		}
		texture = FNullTextureID();
	}
	side->SetTexture(position, texture);
}